

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpStateVarComplete.c
# Opt level: O0

int UpnpStateVarComplete_set_CurrentVal(UpnpStateVarComplete *p,char *s)

{
  char *pcVar1;
  char *q;
  char *s_local;
  UpnpStateVarComplete *p_local;
  
  pcVar1 = ixmlCloneDOMString(s);
  if (pcVar1 != (char *)0x0) {
    ixmlFreeDOMString(p->m_CurrentVal);
    p->m_CurrentVal = pcVar1;
  }
  p_local._4_4_ = (uint)(pcVar1 != (char *)0x0);
  return p_local._4_4_;
}

Assistant:

int UpnpStateVarComplete_set_CurrentVal(
	UpnpStateVarComplete *p, const DOMString s)
{
	DOMString q = ixmlCloneDOMString(s);
	if (!q)
		return 0;
	ixmlFreeDOMString(p->m_CurrentVal);
	p->m_CurrentVal = q;

	return 1;
}